

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

Int128 __thiscall ClipperLib::Int128::operator*(Int128 *this,Int128 *rhs)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long *in_RDX;
  ulong extraout_RDX;
  Int128 IVar9;
  ulong64 c;
  ulong64 b;
  ulong64 a;
  ulong64 int2Lo;
  ulong64 int2Hi;
  ulong64 int1Lo;
  ulong64 int1Hi;
  bool negate;
  Int128 *rhs_local;
  Int128 *this_local;
  Int128 *tmp;
  
  if (((rhs->hi == 0) || (rhs->hi == -1)) && ((*in_RDX == 0 || (*in_RDX == -1)))) {
    lVar1 = rhs->hi;
    lVar2 = *in_RDX;
    Int128(this,rhs);
    if (this->hi < 0) {
      Negate(this);
    }
    uVar4 = (ulong)this->lo >> 0x20;
    uVar5 = this->lo & 0xffffffff;
    this->hi = *in_RDX;
    this->lo = in_RDX[1];
    if (this->hi < 0) {
      Negate(this);
    }
    uVar6 = (ulong)this->lo >> 0x20;
    uVar7 = this->lo & 0xffffffff;
    uVar8 = uVar5 * uVar7;
    uVar7 = uVar4 * uVar7 + uVar5 * uVar6;
    uVar5 = uVar7 >> 0x20;
    this->hi = uVar4 * uVar6 + uVar5;
    this->lo = uVar7 << 0x20;
    this->lo = uVar8 + this->lo;
    if ((ulong)this->lo < uVar8) {
      this->hi = this->hi + 1;
    }
    if (lVar1 < 0 != lVar2 < 0) {
      Negate(this);
      uVar5 = extraout_RDX;
    }
    IVar9.lo = uVar5;
    IVar9.hi = (long64)this;
    return IVar9;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "Int128 operator*: overflow error";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

Int128 operator * (const Int128 &rhs) const
    {
      if ( !(hi == 0 || hi == -1) || !(rhs.hi == 0 || rhs.hi == -1))
        throw "Int128 operator*: overflow error";
      bool negate = (hi < 0) != (rhs.hi < 0);

      Int128 tmp(*this);
      if (tmp.hi < 0) Negate(tmp);
      ulong64 int1Hi = ulong64(tmp.lo) >> 32;
      ulong64 int1Lo = ulong64(tmp.lo & 0xFFFFFFFF);

      tmp = rhs;
      if (tmp.hi < 0) Negate(tmp);
      ulong64 int2Hi = ulong64(tmp.lo) >> 32;
      ulong64 int2Lo = ulong64(tmp.lo & 0xFFFFFFFF);

      //nb: see comments in clipper.pas
      ulong64 a = int1Hi * int2Hi;
      ulong64 b = int1Lo * int2Lo;
      ulong64 c = int1Hi * int2Lo + int1Lo * int2Hi;

      tmp.hi = long64(a + (c >> 32));
      tmp.lo = long64(c << 32);
      tmp.lo += long64(b);
      if (ulong64(tmp.lo) < b) tmp.hi++;
      if (negate) Negate(tmp);
      return tmp;
    }